

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::SourceCodeInfo_Location::MergeFrom
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *from)

{
  uint uVar1;
  RepeatedField<int> *in_RSI;
  SourceCodeInfo_Location *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff18;
  void **in_stack_ffffffffffffff20;
  void **this_00;
  string *in_stack_ffffffffffffff38;
  RepeatedField<int> *in_stack_ffffffffffffff98;
  
  this_00 = &in_RSI->arena_or_elements_;
  if (((uint)*this_00 & 1) == 1) {
    if (((uint)*this_00 & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
      in_stack_ffffffffffffff20 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff20 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  RepeatedField<int>::MergeFrom(in_RSI,in_stack_ffffffffffffff98);
  RepeatedField<int>::MergeFrom(in_RSI,in_stack_ffffffffffffff98);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_ffffffffffffff20,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_ffffffffffffff18);
  uVar1 = in_RSI[1].current_size_;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_leading_comments_abi_cxx11_((SourceCodeInfo_Location *)0x5180d9);
      _internal_set_leading_comments(in_RDI,in_stack_ffffffffffffff38);
    }
    if ((uVar1 & 2) != 0) {
      _internal_trailing_comments_abi_cxx11_((SourceCodeInfo_Location *)0x5180ff);
      _internal_set_trailing_comments(in_RDI,in_stack_ffffffffffffff38);
    }
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::MergeFrom(const SourceCodeInfo_Location& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.SourceCodeInfo.Location)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  path_.MergeFrom(from.path_);
  span_.MergeFrom(from.span_);
  leading_detached_comments_.MergeFrom(from.leading_detached_comments_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_leading_comments(from._internal_leading_comments());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_trailing_comments(from._internal_trailing_comments());
    }
  }
}